

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

_Bool Curl_creader_is_paused(Curl_easy *data)

{
  Curl_creader *pCVar1;
  _Bool _Var2;
  
  pCVar1 = (data->req).reader_stack;
  while ((pCVar1 != (Curl_creader *)0x0 && (_Var2 = (*pCVar1->crt->is_paused)(data,pCVar1), !_Var2))
        ) {
    pCVar1 = pCVar1->next;
  }
  return pCVar1 != (Curl_creader *)0x0;
}

Assistant:

bool Curl_creader_is_paused(struct Curl_easy *data)
{
  struct Curl_creader *reader = data->req.reader_stack;

  while(reader) {
    if(reader->crt->is_paused(data, reader))
      return TRUE;
    reader = reader->next;
  }
  return FALSE;
}